

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::StringReplace
                   (string *__return_storage_ptr__,string *s,string *oldsub,string *newsub,
                   bool replace_all)

{
  bool replace_all_local;
  string *newsub_local;
  string *oldsub_local;
  string *s_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  StringReplace(s,oldsub,newsub,replace_all,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string StringReplace(const std::string &s, const std::string &oldsub,
                          const std::string &newsub, bool replace_all) {
  std::string ret;
  StringReplace(s, oldsub, newsub, replace_all, &ret);
  return ret;
}